

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<const_chaiscript::File_Position_&(const_chaiscript::AST_Node_&),_chaiscript::dispatch::detail::Const_Caller<const_chaiscript::File_Position_&,_chaiscript::AST_Node>_>
::Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<const_chaiscript::File_Position_&(const_chaiscript::AST_Node_&),_chaiscript::dispatch::detail::Const_Caller<const_chaiscript::File_Position_&,_chaiscript::AST_Node>_>
           *this,Const_Caller<const_chaiscript::File_Position_&,_chaiscript::AST_Node> f)

{
  _func_File_Position_ptr_AST_Node_ptr *in_RDX;
  offset_in_AST_Node_to_subr in_RSI;
  _Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> _Stack_38;
  
  detail::build_param_type_list<chaiscript::File_Position_const&,chaiscript::AST_Node_const&>
            ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&_Stack_38,
             (detail *)0x0,in_RDX);
  Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            (&this->super_Proxy_Function_Impl_Base,
             (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&_Stack_38);
  std::_Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~_Vector_base
            (&_Stack_38);
  (this->super_Proxy_Function_Impl_Base).super_Proxy_Function_Base._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Proxy_Function_Base_00328560;
  (this->m_f).m_func = in_RSI;
  *(_func_File_Position_ptr_AST_Node_ptr **)&(this->m_f).field_0x8 = in_RDX;
  return;
}

Assistant:

Proxy_Function_Callable_Impl(Callable f)
          : Proxy_Function_Impl_Base(detail::build_param_type_list(static_cast<Func *>(nullptr))),
            m_f(std::move(f))
        {
        }